

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
::set_main_font(list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
                *this,shared_ptr<dlib::font> *f)

{
  font *this_00;
  data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  *pdVar1;
  int iVar2;
  undefined4 extraout_var;
  unsigned_long i;
  ulong uVar3;
  long lVar4;
  auto_mutex M;
  
  M.r = (this->super_scrollable_region).super_drawable.m;
  M.m = (mutex *)0x0;
  M.rw = (read_write_mutex *)0x0;
  rmutex::lock(M.r,1);
  std::__shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_scrollable_region).super_drawable.mfont.
              super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>,
             &f->super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>);
  lVar4 = 0x30;
  for (uVar3 = 0;
      this_00 = (this->super_scrollable_region).super_drawable.mfont.
                super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      uVar3 < (this->items).array_size; uVar3 = uVar3 + 1) {
    pdVar1 = (this->items).array_elements;
    font::compute_size<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>
              (this_00,(basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)((long)pdVar1 + lVar4 + -0x30),
               (unsigned_long *)((long)pdVar1 + lVar4 + -8),
               (unsigned_long *)((long)&(pdVar1->name)._M_dataplus._M_p + lVar4),0,
               0xffffffffffffffff);
    lVar4 = lVar4 + 0x38;
  }
  iVar2 = (*this_00->_vptr_font[4])();
  scrollable_region::set_vertical_scroll_increment
            (&this->super_scrollable_region,CONCAT44(extraout_var,iVar2));
  base_window::invalidate_rectangle
            (&((this->super_scrollable_region).super_drawable.parent)->super_base_window,
             &(this->super_scrollable_region).super_drawable.rect);
  auto_mutex::~auto_mutex(&M);
  return;
}

Assistant:

void list_box<S>::
    set_main_font (
        const std::shared_ptr<font>& f
    )
    {
        auto_mutex M(m);
        mfont = f;
        // recompute the sizes of all the items
        for (unsigned long i = 0; i < items.size(); ++i)
        {
            mfont->compute_size(items[i].name,items[i].width, items[i].height);
        }
        set_vertical_scroll_increment(mfont->height());
        parent.invalidate_rectangle(rect);
    }